

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::coding_stats::clear(coding_stats *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  in_RDI[0x28d] = 0;
  in_RDI[0x28e] = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  in_RDI[0x28f] = 0;
  *(undefined8 *)(in_RDI + 0x290) = 0;
  *(undefined8 *)(in_RDI + 0x292) = 0;
  in_RDI[0x294] = 0;
  *(undefined8 *)(in_RDI + 0x296) = 0;
  *(undefined8 *)(in_RDI + 0x298) = 0;
  in_RDI[0x29b] = 0;
  in_RDI[0x29a] = 0;
  *(undefined8 *)(in_RDI + 0x29c) = 0;
  *(undefined8 *)(in_RDI + 0x29e) = 0;
  utils::zero_object<unsigned_int[4]>((uint (*) [4])0x11b862);
  utils::zero_object<double[4]>((double (*) [4])0x11b873);
  utils::zero_object<unsigned_int[258]>((uint (*) [258])0x11b884);
  utils::zero_object<double[258]>((double (*) [258])0x11b895);
  utils::zero_object<double[4]>((double (*) [4])0x11b8a6);
  utils::zero_object<double[258]>((double (*) [258])0x11b8b7);
  in_RDI[0x7be] = 0;
  in_RDI[0x7bf] = 0;
  in_RDI[0x289] = 0;
  in_RDI[0x28a] = 0;
  in_RDI[0x28b] = 0;
  in_RDI[0x28c] = 0;
  in_RDI[0xc] = 0;
  utils::zero_object<unsigned_int[258]>((uint (*) [258])0x11b908);
  utils::zero_object<unsigned_int[258]>((uint (*) [258])0x11b919);
  utils::zero_object<unsigned_int[12][5]>((uint (*) [12] [5])0x11b92a);
  utils::zero_object<unsigned_int[12][5]>((uint (*) [12] [5])0x11b93b);
  return;
}

Assistant:

void lzcompressor::coding_stats::clear()
   {
      m_total_bytes = 0;
      m_total_contexts = 0;
      m_total_match_bits_cost = 0;
      m_worst_match_bits_cost = 0;
      m_total_is_match0_bits_cost = 0;
      m_total_is_match1_bits_cost = 0;

      m_total_nonmatches = 0;
      m_total_matches = 0;
      m_total_cost = 0.0f;
      m_total_lits = 0;
      m_total_lit_cost = 0;
      m_worst_lit_cost = 0;
      m_total_delta_lits = 0;
      m_total_delta_lit_cost = 0;
      m_worst_delta_lit_cost = 0;
      m_total_rep0_len1_matches = 0;
      m_total_reps = 0;
      m_total_rep0_len1_cost = 0;
      m_worst_rep0_len1_cost = 0;
      utils::zero_object(m_total_rep_matches);
      utils::zero_object(m_total_rep_cost);
      utils::zero_object(m_total_full_matches);
      utils::zero_object(m_total_full_match_cost);
      utils::zero_object(m_worst_rep_cost);
      utils::zero_object(m_worst_full_match_cost);
      m_total_far_len2_matches = 0;
      m_total_near_len2_matches = 0;
      m_total_is_rep0 = 0;
      m_total_is_rep0_len1 = 0;
      m_total_is_rep1 = 0;
      m_total_is_rep2 = 0;
      m_total_truncated_matches = 0;
      utils::zero_object(m_match_truncation_len_hist);
      utils::zero_object(m_match_truncation_hist);
      utils::zero_object(m_match_type_truncation_hist);
      utils::zero_object(m_match_type_was_not_truncated_hist);
   }